

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

string * __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry::AsString_abi_cxx11_
          (string *__return_storage_ptr__,SymbolEntry *this,DescriptorIndex *index)

{
  bool bVar1;
  char *c_str;
  AlphaNum *in_R8;
  StringPiece str;
  AlphaNum local_d0;
  AlphaNum local_a0;
  char *local_70;
  char *local_68;
  AlphaNum local_60;
  undefined1 local_30 [8];
  StringPiece p;
  DescriptorIndex *index_local;
  SymbolEntry *this_local;
  
  p.length_ = (size_type)index;
  _local_30 = package(this,index);
  local_70 = (char *)local_30;
  local_68 = p.ptr_;
  strings::AlphaNum::AlphaNum(&local_60,_local_30);
  bVar1 = stringpiece_internal::StringPiece::empty((StringPiece *)local_30);
  c_str = ".";
  if (bVar1) {
    c_str = "";
  }
  strings::AlphaNum::AlphaNum(&local_a0,c_str);
  str = symbol(this,(DescriptorIndex *)p.length_);
  strings::AlphaNum::AlphaNum(&local_d0,str);
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_60,&local_a0,&local_d0,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string AsString(const DescriptorIndex& index) const {
      auto p = package(index);
      return StrCat(p, p.empty() ? "" : ".", symbol(index));
    }